

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndsWithMatch.cpp
# Opt level: O1

void __thiscall oout::EndsWithMatch::EndsWithMatch(EndsWithMatch *this,string *text)

{
  pointer pcVar1;
  
  (this->super_Match)._vptr_Match = (_func_int **)&PTR__EndsWithMatch_001993c0;
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  pcVar1 = (text->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->text,pcVar1,pcVar1 + text->_M_string_length);
  return;
}

Assistant:

EndsWithMatch::EndsWithMatch(const string &text)
	: text(text)
{
}